

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O0

bool __thiscall QDtls::abortHandshake(QDtls *this,QUdpSocket *socket)

{
  long lVar1;
  int iVar2;
  pointer s;
  pointer pDVar3;
  long in_RSI;
  long in_FS_OFFSET;
  DtlsCryptograph *backend;
  QDtlsPrivate *d;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  char *c;
  char *in_stack_ffffffffffffff78;
  bool local_39;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QDtls *)0x3bad00);
  s = std::
      unique_ptr<QTlsPrivate::DtlsCryptograph,_std::default_delete<QTlsPrivate::DtlsCryptograph>_>::
      get((unique_ptr<QTlsPrivate::DtlsCryptograph,_std::default_delete<QTlsPrivate::DtlsCryptograph>_>
           *)0x3bad13);
  if (s == (pointer)0x0) {
    local_39 = false;
  }
  else if (in_RSI == 0) {
    lVar1 = *(long *)(*(long *)s + -0x60);
    tr(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    (**(code **)(*(long *)(s + lVar1) + 0x10))(s + lVar1,1,local_20);
    QString::~QString((QString *)0x3bad94);
    local_39 = false;
  }
  else {
    iVar2 = (**(code **)(*(long *)s + 0x90))();
    if (iVar2 != 2) {
      iVar2 = (**(code **)(*(long *)s + 0x90))();
      if (iVar2 != 1) {
        c = *(char **)(*(long *)s + -0x60);
        pDVar3 = s + (long)c;
        tr((char *)s,c,in_stack_ffffffffffffff6c);
        (**(code **)(*(long *)(s + (long)c) + 0x10))(pDVar3,2,local_38);
        QString::~QString((QString *)0x3bae26);
        local_39 = false;
        goto LAB_003bae45;
      }
    }
    (**(code **)(*(long *)s + 0xc0))(s,in_RSI);
    local_39 = true;
  }
LAB_003bae45:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QDtls::abortHandshake(QUdpSocket *socket)
{
    Q_D(QDtls);

    auto *backend = d->backend.get();
    if (!backend)
        return false;

    if (!socket) {
        backend->setDtlsError(QDtlsError::InvalidInputParameters, tr("Invalid (nullptr) socket"));
        return false;
    }

    if (backend->state() != PeerVerificationFailed && backend->state() != HandshakeInProgress) {
        backend->setDtlsError(QDtlsError::InvalidOperation,
                              tr("No handshake in progress, nothing to abort"));
        return false;
    }

    backend->abortHandshake(socket);
    return true;
}